

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * __thiscall
mjs::interpreter::impl::operator()
          (value *__return_storage_ptr__,impl *this,array_literal_expression *e)

{
  pointer puVar1;
  __uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_> e_00;
  gc_heap *pgVar2;
  value *pvVar3;
  long *plVar4;
  uint32_t index;
  uint32_t index_00;
  uint uVar5;
  mjs *this_00;
  object_ptr a;
  value val;
  gc_heap_ptr_untyped local_c0;
  wstring_view local_b0;
  value *local_a0;
  array_literal_expression *local_98;
  value local_90;
  wstring_view local_68;
  wchar_t *local_58;
  anon_union_32_5_7b1e0779_for_value_3 local_50;
  
  uVar5 = 0;
  local_a0 = __return_storage_ptr__;
  local_98 = e;
  make_array((gc_heap_ptr<mjs::global_object> *)&local_c0,(int)this + 0x20);
  while( true ) {
    pvVar3 = local_a0;
    this_00 = (mjs *)(ulong)uVar5;
    puVar1 = (local_98->elements_).
             super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((mjs *)((long)(local_98->elements_).
                      super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= this_00)
    break;
    e_00._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
    super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
         puVar1[(long)this_00]._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t;
    if ((_Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>)
        e_00._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0) {
      plVar4 = (long *)gc_heap_ptr_untyped::get(&local_c0);
      pgVar2 = this->heap_;
      index_string_abi_cxx11_((wstring *)&local_90,this_00,index_00);
      local_b0._M_len = (size_t)local_90.field_1.n_;
      local_b0._M_str = (wchar_t *)local_90._0_8_;
      string::string((string *)&local_58,pgVar2,&local_b0);
      (**(code **)(*plVar4 + 8))(plVar4,(value *)&local_58,&value::undefined,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_58);
      std::__cxx11::wstring::~wstring((wstring *)&local_90);
    }
    else {
      eval((value *)&local_58,this,
           (expression *)
           e_00._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
      get_value(&local_90,this,(value *)&local_58);
      value::~value((value *)&local_58);
      plVar4 = (long *)gc_heap_ptr_untyped::get(&local_c0);
      pgVar2 = this->heap_;
      index_string_abi_cxx11_((wstring *)&local_58,this_00,index);
      local_68._M_len = (size_t)local_50.n_;
      local_68._M_str = local_58;
      string::string((string *)&local_b0,pgVar2,&local_68);
      (**(code **)(*plVar4 + 8))(plVar4,&local_b0,&local_90,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b0);
      std::__cxx11::wstring::~wstring((wstring *)&local_58);
      value::~value(&local_90);
    }
    uVar5 = uVar5 + 1;
  }
  value::value(local_a0,(object_ptr *)&local_c0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c0);
  return pvVar3;
}

Assistant:

value operator()(const array_literal_expression& e) {
        auto a = make_array(global_, 0);
        const auto& es = e.elements();
        for (unsigned i = 0; i < es.size(); ++i) {
            if (es[i]) {
                auto val = get_value(eval(*es[i]));
                a->put(string{heap_, index_string(i)}, val);
            } else {
                a->put(string{heap_, index_string(i)}, value::undefined);
            }
        }
        return value{a};
    }